

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O1

void __thiscall
cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb(cbtPolyhedralConvexAabbCachingShape *this)

{
  float fVar1;
  int i;
  long lVar2;
  float *pfVar3;
  float local_78 [26];
  
  pfVar3 = local_78;
  this->m_isLocalAabbValid = true;
  if (recalcLocalAabb()::_directions == '\0') {
    recalcLocalAabb();
  }
  local_78[0x10] = 0.0;
  local_78[0x11] = 0.0;
  local_78[0x12] = 0.0;
  local_78[0x13] = 0.0;
  local_78[0x14] = 0.0;
  local_78[0x15] = 0.0;
  local_78[0x16] = 0.0;
  local_78[0x17] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 0.0;
  local_78[6] = 0.0;
  local_78[7] = 0.0;
  local_78[8] = 0.0;
  local_78[9] = 0.0;
  local_78[10] = 0.0;
  local_78[0xb] = 0.0;
  local_78[0xc] = 0.0;
  local_78[0xd] = 0.0;
  local_78[0xe] = 0.0;
  local_78[0xf] = 0.0;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0x13])
            (this,recalcLocalAabb::_directions,local_78,6);
  fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_collisionMargin;
  lVar2 = 0;
  do {
    (this->m_localAabbMax).m_floats[lVar2] = fVar1 + *pfVar3;
    (this->m_localAabbMin).m_floats[lVar2] = pfVar3[0xc] - fVar1;
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 5;
  } while (lVar2 != 3);
  return;
}

Assistant:

void cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb()
{
	m_isLocalAabbValid = true;

#if 1
	static const cbtVector3 _directions[] =
		{
			cbtVector3(1., 0., 0.),
			cbtVector3(0., 1., 0.),
			cbtVector3(0., 0., 1.),
			cbtVector3(-1., 0., 0.),
			cbtVector3(0., -1., 0.),
			cbtVector3(0., 0., -1.)};

	cbtVector3 _supporting[] =
		{
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.)};

	batchedUnitVectorGetSupportingVertexWithoutMargin(_directions, _supporting, 6);

	for (int i = 0; i < 3; ++i)
	{
		m_localAabbMax[i] = _supporting[i][i] + m_collisionMargin;
		m_localAabbMin[i] = _supporting[i + 3][i] - m_collisionMargin;
	}

#else

	for (int i = 0; i < 3; i++)
	{
		cbtVector3 vec(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
		vec[i] = cbtScalar(1.);
		cbtVector3 tmp = localGetSupportingVertex(vec);
		m_localAabbMax[i] = tmp[i];
		vec[i] = cbtScalar(-1.);
		tmp = localGetSupportingVertex(vec);
		m_localAabbMin[i] = tmp[i];
	}
#endif
}